

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.c
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  if (action != 1) {
    return;
  }
  if (key == 0x51) {
LAB_00106e2f:
    set_gamma(window,gamma_value + 0.1);
  }
  else {
    if (key != 0x57) {
      if (key == 0x100) {
        glfwSetWindowShouldClose(window,1);
        return;
      }
      if (key != 0x14d) {
        if (key != 0x14e) {
          return;
        }
        goto LAB_00106e2f;
      }
    }
    if (0.0 < gamma_value - 0.1) {
      set_gamma(window,gamma_value - 0.1);
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_ESCAPE:
        {
            glfwSetWindowShouldClose(window, GL_TRUE);
            break;
        }

        case GLFW_KEY_KP_ADD:
        case GLFW_KEY_Q:
        {
            set_gamma(window, gamma_value + STEP_SIZE);
            break;
        }

        case GLFW_KEY_KP_SUBTRACT:
        case GLFW_KEY_W:
        {
            if (gamma_value - STEP_SIZE > 0.f)
                set_gamma(window, gamma_value - STEP_SIZE);

            break;
        }
    }
}